

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

void BinaryenMemoryFillSetDest(BinaryenExpressionRef expr,BinaryenExpressionRef destExpr)

{
  if (expr->_id != MemoryFillId) {
    __assert_fail("expression->is<MemoryFill>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xdf0,
                  "void BinaryenMemoryFillSetDest(BinaryenExpressionRef, BinaryenExpressionRef)");
  }
  if (destExpr != (BinaryenExpressionRef)0x0) {
    *(BinaryenExpressionRef *)(expr + 1) = destExpr;
    return;
  }
  __assert_fail("destExpr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0xdf1,
                "void BinaryenMemoryFillSetDest(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenMemoryFillSetDest(BinaryenExpressionRef expr,
                               BinaryenExpressionRef destExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<MemoryFill>());
  assert(destExpr);
  static_cast<MemoryFill*>(expression)->dest = (Expression*)destExpr;
}